

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageEdgeCircumcenterSign<long_double>
              (Vector3<long_double> *x0,Vector3<long_double> *x1,Vector3<long_double> *a,
              Vector3<long_double> *b,Vector3<long_double> *c,int abc_sign)

{
  int iVar1;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  Vector3<long_double> z;
  longdouble local_58;
  Vector3<long_double> local_48;
  
  GetCircumcenter<long_double>(&local_48,a,b,c,&local_58);
  lVar2 = *(longdouble *)x0->c_ - *(longdouble *)x1->c_;
  lVar3 = *(longdouble *)(x0->c_ + 1) - *(longdouble *)(x1->c_ + 1);
  lVar6 = *(longdouble *)x0->c_ + *(longdouble *)x1->c_;
  lVar5 = *(longdouble *)(x0->c_ + 1) + *(longdouble *)(x1->c_ + 1);
  lVar4 = *(longdouble *)(x0->c_ + 2) - *(longdouble *)(x1->c_ + 2);
  lVar7 = *(longdouble *)(x0->c_ + 2) + *(longdouble *)(x1->c_ + 2);
  lVar3 = ((lVar2 * lVar5 - lVar6 * lVar3) * local_48.c_[2]._0_10_ +
          (lVar4 * lVar6 - lVar7 * lVar2) * local_48.c_[1]._0_10_ +
          (longdouble)0 + (lVar3 * lVar7 - lVar5 * lVar4) * local_48.c_[0]._0_10_) *
          (longdouble)abc_sign;
  lVar2 = in_ST0;
  sqrtl();
  sqrtl();
  lVar2 = in_ST0 * (lVar2 * (longdouble)1.6263033e-19 +
                   (lVar2 * (longdouble)4.464101615137754 + (longdouble)6.153480596427404e-15) *
                   (longdouble)5.421011e-20) + local_58 * lVar2;
  iVar1 = 1;
  if (lVar3 <= lVar2) {
    iVar1 = -(uint)(lVar3 < -lVar2);
  }
  return iVar1;
}

Assistant:

int TriageEdgeCircumcenterSign(const Vector3<T>& x0, const Vector3<T>& x1,
                               const Vector3<T>& a, const Vector3<T>& b,
                               const Vector3<T>& c, int abc_sign) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // Compute the circumcenter Z of triangle ABC, and then test which side of
  // edge X it lies on.
  T z_error;
  Vector3<T> z = GetCircumcenter(a, b, c, &z_error);
  Vector3<T> nx = (x0 - x1).CrossProd(x0 + x1);
  // If the sign of triangle ABC is negative, then we have computed -Z and the
  // result should be negated.
  T result = abc_sign * nx.DotProd(z);

  T z_len = z.Norm();
  T nx_len = nx.Norm();
  T nx_error = ((1 + 2 * sqrt(3)) * nx_len + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T result_error = ((3 * T_ERR * nx_len + nx_error) * z_len + z_error * nx_len);
  return (result > result_error) ? 1 : (result < -result_error) ? -1 : 0;
}